

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_c.h
# Opt level: O0

int __thiscall
dlib::
sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::remove(sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
         *this,char *__filename)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  ulong uVar3;
  string *a;
  ostream *poVar4;
  undefined8 uVar5;
  ostringstream dlib_o_out;
  error_type t;
  ostream local_190;
  char *local_10;
  sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
  *local_8;
  undefined4 extraout_var_00;
  
  local_10 = __filename;
  local_8 = this;
  iVar1 = (*(this->
            super_sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            ).
            super_enumerable<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>_>
            ._vptr_enumerable[8])();
  if ((char *)CONCAT44(extraout_var,iVar1) <= __filename) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    poVar2 = std::operator<<(&local_190,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x87);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_190,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../image_transforms/../statistics/../optimization/../sequence/sequence_kernel_c.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_190,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button>>>::remove(unsigned long, T &) [seq_base = dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button>>]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<(&local_190,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"( pos < this->size() )");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(&local_190,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"\tvoid sequence::remove");
    poVar2 = std::operator<<(poVar2,"\n\tpos must be >= 0 and < size()");
    poVar2 = std::operator<<(poVar2,"\n\tpos: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)local_10);
    poVar2 = std::operator<<(poVar2,"\n\tsize(): ");
    iVar1 = (*(this->
              super_sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
              ).
              super_enumerable<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>_>
              ._vptr_enumerable[8])();
    uVar3 = CONCAT44(extraout_var_00,iVar1);
    a = (string *)std::ostream::operator<<(poVar2,uVar3);
    t = (error_type)(uVar3 >> 0x20);
    poVar4 = std::operator<<((ostream *)a,"\n\tthis: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this);
    std::operator<<(poVar4,"\n");
    uVar5 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,t,a);
    __cxa_throw(uVar5,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  iVar1 = sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
          ::remove(&this->
                    super_sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                   ,local_10);
  return iVar1;
}

Assistant:

void sequence_kernel_c<seq_base>::
    remove (
        unsigned long pos,
        T& item
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT(( pos < this->size() ), 
                "\tvoid sequence::remove"
                << "\n\tpos must be >= 0 and < size()" 
                << "\n\tpos: " << pos 
                << "\n\tsize(): " << this->size()
                << "\n\tthis: " << this
        );

        // call the real function
        seq_base::remove(pos,item);

    }